

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_export.cpp
# Opt level: O1

void __thiscall
sc_core::sc_export_registry::insert(sc_export_registry *this,sc_export_base *export_)

{
  pointer *pppsVar1;
  iterator __position;
  sc_simcontext *this_00;
  sc_module *psVar2;
  char *add_msg;
  char *id;
  sc_export_base *local_20;
  
  local_20 = export_;
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this_00 = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this_00);
    sc_curr_simcontext = this_00;
    sc_default_global_context = this_00;
  }
  if (sc_curr_simcontext->m_ready_to_simulate == true) {
    id = "insert sc_export failed";
    add_msg = "simulation running";
  }
  else if (this->m_simc->m_elaboration_done == true) {
    id = "insert sc_export failed";
    add_msg = "elaboration done";
  }
  else {
    psVar2 = sc_simcontext::hierarchy_curr(this->m_simc);
    if (psVar2 != (sc_module *)0x0) {
      __position._M_current =
           (this->m_export_vec).
           super__Vector_base<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_export_vec).
          super__Vector_base<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_>::
        _M_realloc_insert(&this->m_export_vec,__position,&local_20);
      }
      else {
        *__position._M_current = local_20;
        pppsVar1 = &(this->m_export_vec).
                    super__Vector_base<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppsVar1 = *pppsVar1 + 1;
      }
      return;
    }
    id = "sc_export specified outside of module";
    add_msg = (char *)0x0;
  }
  sc_export_base::report_error(local_20,id,add_msg);
  return;
}

Assistant:

void
sc_export_registry::insert( sc_export_base* export_ )
{
    if( sc_is_running() ) {
        export_->report_error(SC_ID_INSERT_EXPORT_, "simulation running");
        return;
    }

    if( m_simc->elaboration_done()  ) {
        export_->report_error(SC_ID_INSERT_EXPORT_, "elaboration done");
        return;
    }

#ifdef DEBUG_SYSTEMC
    // check if port_ is already inserted
    for( int i = size() - 1; i >= 0; -- i ) {
        if( export_ == m_export_vec[i] ) {
            export_->report_error( SC_ID_INSERT_EXPORT_,
                                   "export already inserted ");
            return;
        }
    }
#endif

    sc_module* curr_module = m_simc->hierarchy_curr();
    if( curr_module == 0 ) {
        export_->report_error( SC_ID_EXPORT_OUTSIDE_MODULE_ );
        return;
    }

    // insert
    m_export_vec.push_back( export_ );
}